

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::UnpackHalf2x16Case::iterate(UnpackHalf2x16Case *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  ShaderExecutor *pSVar3;
  UnpackHalf2x16Case *pUVar4;
  bool bVar5;
  Float<unsigned_short,_5,_10,_15,_3U> FVar6;
  Float<unsigned_short,_5,_10,_15,_3U> FVar7;
  deUint32 dVar8;
  uint uVar9;
  deUint32 dVar10;
  int iVar11;
  Float<unsigned_int,_8,_23,_127,_3U> FVar12;
  Float<unsigned_int,_8,_23,_127,_3U> FVar13;
  int iVar14;
  int iVar15;
  char *description;
  sbyte sVar16;
  long lVar17;
  bool bVar18;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  deUint32 inVal;
  int local_224;
  Hex<8UL> local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  UnpackHalf2x16Case *local_200;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_200 = this;
  dVar8 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar8 ^ 0x776002);
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1d8 = (pointer)0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1b0._0_4_ = 0;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_1b0._0_4_ = 0x3f800000;
  FVar7 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_220.value._0_4_ = CONCAT22(FVar6.m_value,FVar7.m_value);
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_218,
               (iterator)
               local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_220);
  }
  else {
    *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_220.value;
    local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x3f800000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  FVar7 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_220.value._0_4_ = CONCAT22(FVar6.m_value,FVar7.m_value);
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_218,
               (iterator)
               local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_220);
  }
  else {
    *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_220.value;
    local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xbf800000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_1b0._0_4_ = 0x3f000000;
  FVar7 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_220.value._0_4_ = CONCAT22(FVar6.m_value,FVar7.m_value);
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_218,
               (iterator)
               local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_220);
  }
  else {
    *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_220.value;
    local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x3f000000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_1b0._0_4_ = 0xbf000000;
  FVar7 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
  local_220.value._0_4_ = CONCAT22(FVar6.m_value,FVar7.m_value);
  if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_218,
               (iterator)
               local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_220);
  }
  else {
    *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = CONCAT22(FVar6.m_value,FVar7.m_value);
    local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar11 = 0;
  do {
    local_1b0._0_4_ = 0;
    sVar16 = 0;
    bVar5 = true;
    do {
      bVar18 = bVar5;
      uVar9 = deRandom_getBool(&local_1c0);
      dVar8 = deRandom_getUint32(&local_1c0);
      dVar10 = deRandom_getUint32(&local_1c0);
      iVar15 = (dVar8 / 0x1e) * -0x1f + dVar8 / 0x1e;
      if (uVar9 != 1) {
        uVar9 = 0x8000;
      }
      local_1b0._0_4_ =
           ((uVar9 | (iVar15 + dVar8 + -0xe + (uint)(iVar15 + dVar8 == 0xe)) * 0x400 + 0x3c00) &
            0xfc00 | dVar10 & 0x3ff) << sVar16 | local_1b0._0_4_;
      sVar16 = 0x10;
      bVar5 = false;
    } while (bVar18);
    if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_218,
                 (iterator)
                 local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1b0._0_4_;
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x60);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_1e8,
             (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0._0_8_ =
       ((local_200->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pUVar4 = local_200;
  local_1b0._0_8_ =
       local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_220.value = local_1e8._0_8_;
  (*((local_200->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar3 = (pUVar4->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar3->_vptr_ShaderExecutor[6])
            (pSVar3,(ulong)((long)local_218.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_218.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_220
            );
  local_1c8 = (ulong)((long)local_218.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  if ((int)local_1c8 < 1) {
    local_224 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar17 = 0;
    local_224 = 0;
    do {
      uVar2 = *(undefined4 *)
               ((long)(qpTestLog **)
                      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
      local_1b0._0_2_ = (StorageType_conflict)uVar2;
      FVar12 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)local_1b0);
      local_1b0._0_2_ = (short)((uint)uVar2 >> 0x10);
      FVar13 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)local_1b0);
      local_1f0 = ((pointer)(local_1e8._0_8_ + lVar17 * 8))->m_data[0];
      local_1f8 = ((pointer)(local_1e8._0_8_ + lVar17 * 8))->m_data[1];
      iVar15 = FVar12.m_value - (int)local_1f0;
      iVar11 = -iVar15;
      if (0 < iVar15) {
        iVar11 = iVar15;
      }
      iVar14 = FVar13.m_value - (int)local_1f8;
      iVar15 = -iVar14;
      if (0 < iVar14) {
        iVar15 = iVar14;
      }
      local_1f4 = local_1f8;
      local_1ec = local_1f0;
      if ((0 < iVar11) || (0 < iVar15)) {
        if (local_224 < 10) {
          local_1b0._0_8_ =
               ((local_200->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackHalf2x16(",0x1a);
          local_220.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_218.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec2(",5);
          std::ostream::_M_insert<double>((double)(float)FVar12.m_value);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_220.value = (deUint64)FVar12.m_value;
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)(float)FVar13.m_value);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_220.value = (deUint64)FVar13.m_value;
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got vec2(",0xb);
          std::ostream::_M_insert<double>((double)local_1ec);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_220.value = (deUint64)(uint)local_1f0;
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)local_1f4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_220.value = (deUint64)(uint)local_1f8;
          tcu::Format::Hex<8UL>::toStream(&local_220,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\n  ULP diffs = (",0x10);
          std::ostream::operator<<(poVar1,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::operator<<(poVar1,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), max diff = ",0xe)
          ;
          std::ostream::operator<<(poVar1,0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_014b053c:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
        }
        else if (local_224 == 10) {
          local_1b0._0_8_ =
               ((local_200->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_014b053c;
        }
        local_224 = local_224 + 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)((ulong)((long)local_218.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_218.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_1b0._0_8_ =
       ((local_200->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar11 = (int)local_1c8;
  std::ostream::operator<<(poVar1,iVar11 - local_224);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  if (local_224 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((local_200->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,(uint)(local_224 != 0),description);
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
  }
  if ((TestLog *)
      local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // All bits must be accurate.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		// Special values.
		inputs.push_back((tcu::Float16( 0.0f).bits() << 16) | tcu::Float16( 1.0f).bits());
		inputs.push_back((tcu::Float16( 1.0f).bits() << 16) | tcu::Float16( 0.0f).bits());
		inputs.push_back((tcu::Float16(-1.0f).bits() << 16) | tcu::Float16( 0.5f).bits());
		inputs.push_back((tcu::Float16( 0.5f).bits() << 16) | tcu::Float16(-0.5f).bits());

		// Construct random values.
		{
			const int	minExp		= -14;
			const int	maxExp		= 15;
			const int	mantBits	= 10;

			for (int ndx = 0; ndx < 96; ndx++)
			{
				deUint32 inVal = 0;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<mantBits)-1);
					const deUint16	value		= tcu::Float16::construct(s, exp ? exp : 1 /* avoid denorm */, (deUint16)((1u<<10) | mantissa)).bits();

					inVal |= value << (16*c);
				}
				inputs.push_back(inVal);
			}
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= tcu::Float16(in0).asFloat();
				const float		ref1		= tcu::Float16(in1).asFloat();
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	refBits0	= tcu::Float32(ref0).bits();
				const deUint32	refBits1	= tcu::Float32(ref1).bits();
				const deUint32	resBits0	= tcu::Float32(res0).bits();
				const deUint32	resBits1	= tcu::Float32(res1).bits();

				const int		diff0	= de::abs((int)refBits0 - (int)resBits0);
				const int		diff1	= de::abs((int)refBits1 - (int)resBits1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackHalf2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << ref0 << " / " << tcu::toHex(refBits0) << ", " << ref1 << " / " << tcu::toHex(refBits1) << ")"
															   << ", got vec2(" << res0 << " / " << tcu::toHex(resBits0) << ", " << res1 << " / " << tcu::toHex(resBits1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}